

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

ostream * rlib::operator<<(ostream *os,JsonT<void> *json)

{
  Format *in_RSI;
  ostream *in_RDI;
  undefined8 in_stack_ffffffffffffff90;
  Stringify *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  Stringify local_20;
  ostream *local_8;
  
  local_8 = in_RDI;
  JsonT<void>::Stringify::Format::Format((Format *)in_stack_ffffffffffffff90);
  JsonT<void>::Stringify::Stringify
            (&local_20,(JsonT<void> *)in_RSI,(Format *)&stack0xffffffffffffff80);
  operator<<((ostream *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  JsonT<void>::Stringify::Format::~Format(in_RSI);
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const JsonT& json) {
			os << Stringify(json, typename Stringify::Format());
			return os;
		}